

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O3

void __thiscall google::protobuf::UnknownFieldSet::~UnknownFieldSet(UnknownFieldSet *this)

{
  int iVar1;
  
  iVar1 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (iVar1 != 0) {
    ClearFallback(this);
  }
  RepeatedField<google::protobuf::UnknownField>::~RepeatedField(&this->fields_);
  return;
}

Assistant:

inline UnknownFieldSet::~UnknownFieldSet() { Clear(); }